

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

bool __thiscall slang::parsing::Parser::isVariableDeclaration(Parser *this)

{
  bool bVar1;
  TokenKind TVar2;
  uint in_EAX;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  Token TVar6;
  uint32_t index;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  bVar1 = scanAttributes(this,(uint32_t *)((long)&uStack_18 + 4));
  if (bVar1) {
    TVar6 = ParserBase::peek(&this->super_ParserBase,uStack_18._4_4_);
    TVar2 = TVar6.kind;
    uVar3 = (uint)TVar2;
    if (TVar2 < TimeKeyword) {
      uVar5 = (ulong)(TVar2 - 0xea);
      if (TVar2 - 0xea < 0x38) {
        if ((0x8060000b00000U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_00677ed8;
        if ((0x80000000000001U >> (uVar5 & 0x3f) & 1) != 0) {
          return true;
        }
        if (uVar5 == 0x32) {
          TVar6 = ParserBase::peek(&this->super_ParserBase,uStack_18._4_4_ + 1);
          TVar2 = TVar6.kind;
          if (TVar2 == ConstraintKeyword) {
            return false;
          }
          if (TVar2 != FunctionKeyword) {
            if (TVar2 != TaskKeyword) {
              return true;
            }
            return false;
          }
          return false;
        }
      }
      uVar4 = TVar2 - 0xbd;
      if (uVar4 < 0x20) {
        if ((0xc00300U >> (uVar4 & 0x1f) & 1) != 0) goto LAB_00677ed8;
        if ((0x80220000U >> (uVar4 & 0x1f) & 1) != 0) {
          return true;
        }
        if (uVar4 == 0) {
          TVar6 = ParserBase::peek(&this->super_ParserBase,uStack_18._4_4_ + 1);
          bVar1 = TVar6.kind == StringLiteral;
          goto LAB_00677f41;
        }
      }
      uVar3 = uVar3 - 0x67;
      if (uVar3 < 0x3c) {
        if ((0xc00000000010001U >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
          return true;
        }
        if ((0x400840UL >> ((ulong)uVar3 & 0x3f) & 1) != 0) goto LAB_00677ed8;
      }
    }
    else if (TVar2 < TypedefKeyword) {
      if (TVar2 == TimeKeyword) {
LAB_00677ed8:
        uStack_18._4_4_ = uStack_18._4_4_ + 1;
        TVar6 = ParserBase::peek(&this->super_ParserBase,uStack_18._4_4_);
        return (ushort)(TVar6.kind - OpenBrace) < 0xfffe;
      }
      if (TVar2 == TypeKeyword) {
        uStack_18._4_4_ = uStack_18._4_4_ + 1;
        TVar6 = ParserBase::peek(&this->super_ParserBase,uStack_18._4_4_);
        if (TVar6.kind != OpenParenthesis) {
          return false;
        }
        uStack_18._4_4_ = uStack_18._4_4_ + 1;
        bVar1 = scanTypePart<&slang::syntax::SyntaxFacts::isNotInType>
                          (this,(uint32_t *)((long)&uStack_18 + 4),OpenParenthesis,CloseParenthesis)
        ;
        if (!bVar1) {
          return false;
        }
        goto LAB_00677e99;
      }
    }
    else {
      if (TVar2 - 0x139 < 2) {
        return true;
      }
      if (uVar3 == 0x143) {
        return true;
      }
      if (uVar3 == 0x145) {
        uStack_18._4_4_ = uStack_18._4_4_ + 1;
        TVar6 = ParserBase::peek(&this->super_ParserBase,uStack_18._4_4_);
        if (TVar6.kind == InterfaceKeyword) {
          return true;
        }
        bVar1 = scanQualifiedName(this,(uint32_t *)((long)&uStack_18 + 4),false);
        if (!bVar1) {
          return false;
        }
        TVar6 = ParserBase::peek(&this->super_ParserBase,uStack_18._4_4_);
        if (TVar6.kind == Dot) {
          return true;
        }
LAB_00677e99:
        TVar6 = ParserBase::peek(&this->super_ParserBase,uStack_18._4_4_);
        return TVar6.kind == Identifier;
      }
    }
    bVar1 = scanQualifiedName(this,(uint32_t *)((long)&uStack_18 + 4),false);
    if (!bVar1) {
      return false;
    }
    bVar1 = scanDimensionList(this,(uint32_t *)((long)&uStack_18 + 4));
    if (bVar1) {
      TVar6 = ParserBase::peek(&this->super_ParserBase,uStack_18._4_4_);
      if (TVar6.kind == Identifier) {
        TVar6 = ParserBase::peek(&this->super_ParserBase,uStack_18._4_4_ + 1);
        bVar1 = TVar6.kind == OpenParenthesis;
LAB_00677f41:
        return !bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool Parser::isVariableDeclaration() {
    uint32_t index = 0;
    if (!scanAttributes(index))
        return false;

    // decide whether a statement is a declaration or the start of an expression
    auto kind = peek(index).kind;
    switch (kind) {
        // some tokens unambiguously start a declaration
        case TokenKind::VarKeyword:
        case TokenKind::AutomaticKeyword:
        case TokenKind::CHandleKeyword:
        case TokenKind::EventKeyword:
        case TokenKind::StructKeyword:
        case TokenKind::UnionKeyword:
        case TokenKind::EnumKeyword:
        case TokenKind::TypedefKeyword:
        case TokenKind::NetTypeKeyword:
        case TokenKind::LocalParamKeyword:
        case TokenKind::ParameterKeyword:
        case TokenKind::LetKeyword:
            return true;

        // Static keyword *should* always be a variable, but it could accidentally
        // be an attempt at an out-of-block function declaration, or it could legitimately
        // be an out-of-block constraint declaration.
        case TokenKind::StaticKeyword: {
            auto next = peek(index + 1);
            return next.kind != TokenKind::FunctionKeyword && next.kind != TokenKind::TaskKeyword &&
                   next.kind != TokenKind::ConstraintKeyword;
        }

        // either an import of a package or a DPI import
        case TokenKind::ImportKeyword:
            return peek(index + 1).kind != TokenKind::StringLiteral;

        // this could be a virtual interface, a virtual class declaration, or a virtual function
        case TokenKind::VirtualKeyword:
            if (peek(++index).kind == TokenKind::InterfaceKeyword)
                return true;
            if (!scanQualifiedName(index, /* allowNew */ false))
                return false;
            if (peek(index).kind == TokenKind::Dot)
                return true;
            return peek(index).kind == TokenKind::Identifier;

        // some cases might be a cast expression
        case TokenKind::StringKeyword:
        case TokenKind::ConstKeyword:
        case TokenKind::BitKeyword:
        case TokenKind::LogicKeyword:
        case TokenKind::RegKeyword:
        case TokenKind::ByteKeyword:
        case TokenKind::ShortIntKeyword:
        case TokenKind::IntKeyword:
        case TokenKind::LongIntKeyword:
        case TokenKind::IntegerKeyword:
        case TokenKind::TimeKeyword:
        case TokenKind::ShortRealKeyword:
        case TokenKind::RealKeyword:
        case TokenKind::RealTimeKeyword: {
            auto next = peek(++index).kind;
            return next != TokenKind::Apostrophe && next != TokenKind::ApostropheOpenBrace;
        }

        // if this is the type operator it's technically not allowed to be a variable
        // declaration without a "var" prefix, but we'll try to allow it anyway and
        // diagnose it later with a better error message.
        case TokenKind::TypeKeyword: {
            if (peek(++index).kind != TokenKind::OpenParenthesis)
                return false;

            index++;
            if (!scanTypePart<isNotInType>(index, TokenKind::OpenParenthesis,
                                           TokenKind::CloseParenthesis)) {
                return false;
            }
            return peek(index).kind == TokenKind::Identifier;
        }

        default:
            break;
    }

    if (!scanQualifiedName(index, /* allowNew */ false))
        return false;

    // might be a list of dimensions here
    if (!scanDimensionList(index))
        return false;

    // next token is the decider; declarations must have an identifier here
    // and there can't be an open parenthesis right after it.
    return peek(index).kind == TokenKind::Identifier &&
           peek(index + 1).kind != TokenKind::OpenParenthesis;
}